

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void fixstabs(ObjectUnit *ou)

{
  StabDebug *stab;
  ObjectUnit *ou_local;
  
  for (stab = (StabDebug *)(ou->stabs).first; (stab->n).next != (node *)0x0;
      stab = (StabDebug *)(stab->n).next) {
    if (stab->relsect != (Section *)0x0) {
      stab->n_value = (int)stab->relsect->va + stab->n_value;
    }
  }
  return;
}

Assistant:

void fixstabs(struct ObjectUnit *ou)
/* fix offsets of relocatable stab entries */
{
  struct StabDebug *stab;

  for (stab=(struct StabDebug *)ou->stabs.first;
       stab->n.next!=NULL; stab=(struct StabDebug *)stab->n.next) {
    if (stab->relsect) {
      stab->n_value += (uint32_t)stab->relsect->va;
    }
  }
}